

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

long __thiscall tetgenmesh::removeslivers(tetgenmesh *this,int chkencflag)

{
  uint *puVar1;
  triface *cosmaxd;
  tetrahedron *pppdVar2;
  memorypool *pmVar3;
  void **ppvVar4;
  int iVar5;
  arraypool *paVar6;
  long *plVar7;
  char *pcVar8;
  char *pcVar9;
  int *piVar10;
  arraypool *this_00;
  long lVar11;
  long lVar12;
  triface *ptVar13;
  undefined8 uVar14;
  long lVar15;
  ulong uVar16;
  undefined8 uVar17;
  bool bVar18;
  byte bVar19;
  long local_b0;
  double maxcosd;
  long local_98;
  undefined8 local_90;
  arraypool *local_88;
  triface *local_80;
  triface slitet;
  double cosdd [6];
  
  bVar19 = 0;
  uVar17 = 0;
  slitet.tet = (tetrahedron *)0x0;
  slitet.ver = 0;
  paVar6 = (arraypool *)operator_new(0x30);
  paVar6->objectbytes = 0x88;
  paVar6->objectsperblock = 0x400;
  paVar6->log2objectsperblock = 10;
  paVar6->objectsperblockmark = 0x3ff;
  paVar6->toparraylen = 0;
  paVar6->toparray = (char **)0x0;
  paVar6->objects = 0;
  paVar6->totalmemory = 0;
  lVar11 = 0;
  uVar14 = 0;
  do {
    this_00 = this->unflipqueue;
    this->unflipqueue = paVar6;
    if ((this_00->objects < 1) || (this->steinerleft == 0)) break;
    local_90 = uVar17;
    if (1 < this->b->verbose) {
      printf("    Splitting bad quality tets [%d]#:  %ld.\n",uVar14);
    }
    local_98 = lVar11;
    if (this_00->objects < 1) {
      local_b0 = 0;
    }
    else {
      local_b0 = 0;
      if (this->steinerleft != 0) {
        lVar11 = 0;
        local_b0 = 0;
        local_88 = this_00;
        do {
          pcVar9 = this_00->toparray[(uint)lVar11 >> ((byte)this_00->log2objectsperblock & 0x1f)];
          lVar15 = (long)this_00->objectbytes *
                   (long)(int)(this_00->objectsperblockmark & (uint)lVar11);
          ptVar13 = (triface *)(pcVar9 + lVar15);
          iVar5 = gettetrahedron(this,*(point *)(pcVar9 + lVar15 + 0x58),
                                 *(point *)(pcVar9 + lVar15 + 0x60),
                                 *(point *)(pcVar9 + lVar15 + 0x68),
                                 *(point *)(pcVar9 + lVar15 + 0x70),ptVar13);
          if (iVar5 != 0) {
            cosmaxd = ptVar13 + 2;
            if ((((double)ptVar13[2].tet == 0.0) && (!NAN((double)ptVar13[2].tet))) ||
               (ptVar13->ver != 0xb)) {
              pppdVar2 = ptVar13->tet;
              tetalldihedral(this,(point)pppdVar2[4],(point)pppdVar2[5],(point)pppdVar2[6],
                             (point)pppdVar2[7],(double *)&ptVar13[2].ver,(double *)cosmaxd,
                             (double *)0x0);
            }
            if ((double)cosmaxd->tet <= this->cosslidihed &&
                this->cosslidihed != (double)cosmaxd->tet) {
              slitet.tet = ptVar13->tet;
              bVar18 = true;
              piVar10 = edge2ver;
              uVar16 = 0;
              local_80 = cosmaxd;
              do {
                if (*(double *)(&ptVar13[2].ver + uVar16 * 2) < this->cosslidihed) {
                  slitet.ver = *piVar10;
                  iVar5 = splitsliver(this,&slitet,*(double *)(&ptVar13[2].ver + uVar16 * 2),
                                      chkencflag);
                  if (iVar5 != 0) {
                    local_b0 = local_b0 + 1;
                    break;
                  }
                }
                bVar18 = uVar16 < 5;
                uVar16 = uVar16 + 1;
                piVar10 = piVar10 + 1;
              } while (uVar16 != 6);
              this_00 = local_88;
              if (bVar18) {
                pmVar3 = this->badtetrahedrons;
                ppvVar4 = pmVar3->firstblock;
                pmVar3->pathblock = ppvVar4;
                pmVar3->pathitem =
                     (void *)((long)ppvVar4 +
                             (((long)pmVar3->alignbytes + 8U) -
                             (ulong)(ppvVar4 + 1) % (ulong)(long)pmVar3->alignbytes));
                pmVar3->pathitemsleft = pmVar3->itemsperblock;
                plVar7 = (long *)memorypool::traverse(pmVar3);
                while (plVar7 != (long *)0x0) {
                  lVar15 = *plVar7;
                  puVar1 = (uint *)(lVar15 + (long)this->elemmarkerindex * 4);
                  *puVar1 = *puVar1 & 0xffffefff;
                  tetalldihedral(this,*(point *)(lVar15 + 0x20),*(point *)(lVar15 + 0x28),
                                 *(point *)(lVar15 + 0x30),*(point *)(lVar15 + 0x38),cosdd,&maxcosd,
                                 (double *)0x0);
                  if (maxcosd < this->cosslidihed) {
                    paVar6 = this->unflipqueue;
                    pcVar8 = arraypool::getblock(paVar6,(int)paVar6->objects);
                    lVar12 = (long)paVar6->objectbytes *
                             ((long)paVar6->objectsperblock - 1U & paVar6->objects);
                    paVar6->objects = paVar6->objects + 1;
                    *(undefined8 *)(pcVar8 + lVar12 + 0x58) = *(undefined8 *)(lVar15 + 0x20);
                    *(undefined8 *)(pcVar8 + lVar12 + 0x60) = *(undefined8 *)(lVar15 + 0x28);
                    *(undefined8 *)(pcVar8 + lVar12 + 0x68) = *(undefined8 *)(lVar15 + 0x30);
                    *(undefined8 *)(pcVar8 + lVar12 + 0x70) = *(undefined8 *)(lVar15 + 0x38);
                    *(long *)(pcVar8 + lVar12) = *plVar7;
                    pcVar9 = pcVar8 + lVar12 + 8;
                    pcVar9[0] = '\v';
                    pcVar9[1] = '\0';
                    pcVar9[2] = '\0';
                    pcVar9[3] = '\0';
                    *(double *)(pcVar8 + lVar12 + 0x20) = maxcosd;
                    lVar15 = 0;
                    do {
                      *(double *)(pcVar8 + lVar15 * 8 + lVar12 + 0x28) = cosdd[lVar15];
                      lVar15 = lVar15 + 1;
                    } while (lVar15 != 6);
                  }
                  plVar7 = (long *)memorypool::traverse(this->badtetrahedrons);
                }
                pmVar3 = this->badtetrahedrons;
                pmVar3->items = 0;
                pmVar3->maxitems = 0;
                ppvVar4 = pmVar3->firstblock;
                pmVar3->nowblock = ppvVar4;
                pmVar3->nextitem =
                     (void *)((long)ppvVar4 +
                             (((long)pmVar3->alignbytes + 8U) -
                             (ulong)(ppvVar4 + 1) % (ulong)(long)pmVar3->alignbytes));
                pmVar3->unallocateditems = pmVar3->itemsperblock;
                pmVar3->deaditemstack = (void *)0x0;
              }
              else {
                paVar6 = this->unflipqueue;
                pcVar9 = arraypool::getblock(paVar6,(int)paVar6->objects);
                uVar16 = paVar6->objects;
                paVar6->objects = uVar16 + 1;
                pcVar9 = pcVar9 + (long)paVar6->objectbytes *
                                  ((long)paVar6->objectsperblock - 1U & uVar16);
                *(tetrahedron **)pcVar9 = ptVar13->tet;
                *(int *)(pcVar9 + 8) = ptVar13->ver;
                *(tetrahedron **)(pcVar9 + 0x10) = ptVar13[1].tet;
                *(int *)(pcVar9 + 0x18) = ptVar13[1].ver;
                ptVar13 = local_80;
                pcVar9 = pcVar9 + 0x20;
                for (lVar15 = 0xd; lVar15 != 0; lVar15 = lVar15 + -1) {
                  *(tetrahedron **)pcVar9 = ptVar13->tet;
                  ptVar13 = (triface *)&ptVar13[-(ulong)bVar19].ver;
                  pcVar9 = pcVar9 + (ulong)bVar19 * -0x10 + 8;
                }
              }
            }
          }
          lVar11 = lVar11 + 1;
        } while ((lVar11 < this_00->objects) && (this->steinerleft != 0));
      }
    }
    this_00->objects = 0;
    if (1 < this->b->verbose) {
      printf("    Split %ld tets.\n",local_b0);
    }
    lVar11 = local_98 + local_b0;
    uVar14 = 1;
    uVar17 = CONCAT71((int7)((ulong)local_b0 >> 8),1);
    paVar6 = this_00;
  } while ((~(byte)local_90 & local_b0 != 0) != 0);
  if (this_00 != (arraypool *)0x0) {
    arraypool::~arraypool(this_00);
    operator_delete(this_00,0x30);
  }
  return lVar11;
}

Assistant:

long tetgenmesh::removeslivers(int chkencflag)
{
  arraypool *flipqueue, *swapqueue;
  badface *bface, *parybface;
  triface slitet, *parytet;
  point *ppt;
  REAL cosdd[6], maxcosd;
  long totalsptcount, sptcount;
  int iter, i, j, k;

  //assert(unflipqueue->objects > 0l);
  flipqueue = new arraypool(sizeof(badface), 10);

  // Swap the two flip queues.
  swapqueue = flipqueue;
  flipqueue = unflipqueue;
  unflipqueue = swapqueue;

  totalsptcount = 0l;
  iter = 0;

  while ((flipqueue->objects > 0l) && (steinerleft != 0)) {

    sptcount = 0l;

    if (b->verbose > 1) {
      printf("    Splitting bad quality tets [%d]#:  %ld.\n",
             iter, flipqueue->objects);
    }

    for (k = 0; (k < flipqueue->objects) && (steinerleft != 0); k++) {      
      bface  = (badface *) fastlookup(flipqueue, k);
      if (gettetrahedron(bface->forg, bface->fdest, bface->fapex,
                         bface->foppo, &bface->tt)) {
        if ((bface->key == 0) || (bface->tt.ver != 11)) {
          // Here we need to re-compute the quality. Since other smoothing
          //   operation may have moved the vertices of this tet.
          ppt = (point *) & (bface->tt.tet[4]);
          tetalldihedral(ppt[0], ppt[1], ppt[2], ppt[3], bface->cent, 
                         &bface->key, NULL);
        }
        if (bface->key < cosslidihed) { 
          // It is a sliver. Try to split it.
          slitet.tet = bface->tt.tet;
          //cosdd = bface->cent;
          for (j = 0; j < 6; j++) {
            if (bface->cent[j] < cosslidihed) { 
              // Found a large dihedral angle.
              slitet.ver = edge2ver[j]; // Go to the edge.
              if (splitsliver(&slitet, bface->cent[j], chkencflag)) {
                sptcount++;
                break;
              }
            }
          } // j
          if (j < 6) {
            // A sliver is split. Queue new slivers.
            badtetrahedrons->traversalinit();
            parytet = (triface *) badtetrahedrons->traverse();
            while (parytet != NULL) {
              unmarktest2(*parytet);
              ppt = (point *) & (parytet->tet[4]);
              tetalldihedral(ppt[0], ppt[1], ppt[2], ppt[3], cosdd, 
                             &maxcosd, NULL);
              if (maxcosd < cosslidihed) {
                // A new sliver. Queue it.
                unflipqueue->newindex((void **) &parybface);
                parybface->forg = ppt[0];
                parybface->fdest = ppt[1];
                parybface->fapex = ppt[2];
                parybface->foppo = ppt[3];
                parybface->tt.tet = parytet->tet;
                parybface->tt.ver = 11;
                parybface->key = maxcosd;
                for (i = 0; i < 6; i++) {
                  parybface->cent[i] = cosdd[i];
                }
              }
              parytet = (triface *) badtetrahedrons->traverse();
            }
            badtetrahedrons->restart();
          } else {
            // Didn't split. Queue it again.
            unflipqueue->newindex((void **) &parybface);
            *parybface = *bface;
          } // if (j == 6)
        } // if (bface->key < cosslidihed)
      } // if (gettetrahedron(...))
    } // k

    flipqueue->restart();

    if (b->verbose > 1) {
      printf("    Split %ld tets.\n", sptcount);
    }
    totalsptcount += sptcount;

    if (sptcount == 0l) {
      // No point has been smoothed. 
      break;
    } else {
      iter++;
      if (iter == 2) { //if (iter >= b->optpasses) {
        break;
      }
    }

    // Swap the two flip queues.
    swapqueue = flipqueue;
    flipqueue = unflipqueue;
    unflipqueue = swapqueue;
  } // while

  delete flipqueue;

  return totalsptcount;
}